

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_shift_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  pTVar1 = gen_ea(env,s,insn,1,tcg_ctx->NULL_QREG,&addr,((insn & 8) == 0) + EA_LOADU,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    tcg_gen_movi_i32(tcg_ctx,QREG_CC_V,0);
    if ((insn >> 8 & 1) == 0) {
      tcg_gen_mov_i32(tcg_ctx,QREG_CC_C,pTVar1);
      if ((insn & 8) == 0) {
        tcg_gen_sari_i32_m68k(tcg_ctx,QREG_CC_N,pTVar1,1);
      }
      else {
        tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_N,pTVar1,1);
      }
    }
    else {
      tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,pTVar1,0xf);
      tcg_gen_shli_i32_m68k(tcg_ctx,QREG_CC_N,pTVar1,1);
      if (((insn & 8) == 0) && ((s->env->features & 1) != 0)) {
        pTVar1 = gen_extend(s,pTVar1,1,1);
        tcg_gen_xor_i32(tcg_ctx,QREG_CC_V,QREG_CC_N,pTVar1);
      }
    }
    tcg_gen_ext16s_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N);
    tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_C,QREG_CC_C,1);
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_X,QREG_CC_C);
    pTVar1 = gen_ea(env,s,insn,1,QREG_CC_N,&addr,EA_STORE,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      set_cc_op(s,CC_OP_FLAGS);
      return;
    }
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(shift_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int logical = insn & 8;
    int left = insn & 0x100;
    TCGv src;
    TCGv addr;

    SRC_EA(env, src, OS_WORD, !logical, &addr);
    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
    if (left) {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, src, 15);
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, 1);

        /*
         * Note that ColdFire always clears V,
         * while M68000 sets if the most significant bit is changed at
         * any time during the shift operation
         */
        if (!logical && m68k_feature(s->env, M68K_FEATURE_M68000)) {
            src = gen_extend(s, src, OS_WORD, 1);
            tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_N, src);
        }
    } else {
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, src);
        if (logical) {
            tcg_gen_shri_i32(tcg_ctx, QREG_CC_N, src, 1);
        } else {
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_N, src, 1);
        }
    }

    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, OS_WORD, 1);
    tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 1);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_X, QREG_CC_C);

    DEST_EA(env, insn, OS_WORD, QREG_CC_N, &addr);
    set_cc_op(s, CC_OP_FLAGS);
}